

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O0

void av1_get_tile_limits(AV1_COMMON *cm)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  long in_RDI;
  int max_tile_area_sb;
  int sb_size_log2;
  int sb_rows;
  int sb_cols;
  CommonTileParams *tiles;
  SequenceHeader *seq_params;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  
  lVar1 = *(long *)(in_RDI + 0x6088);
  iVar2 = *(int *)(in_RDI + 0x218) + (1 << ((byte)*(undefined4 *)(lVar1 + 0x24) & 0x1f)) + -1 >>
          ((byte)*(undefined4 *)(lVar1 + 0x24) & 0x1f);
  iVar3 = *(int *)(in_RDI + 0x214) + (1 << ((byte)*(undefined4 *)(lVar1 + 0x24) & 0x1f)) + -1 >>
          ((byte)*(undefined4 *)(lVar1 + 0x24) & 0x1f);
  bVar5 = (char)*(undefined4 *)(lVar1 + 0x24) + 2;
  *(int *)(in_RDI + 0x60a8) = 0x1000 >> (bVar5 & 0x1f);
  iVar4 = tile_log2(*(int *)(in_RDI + 0x60a8),iVar2);
  *(int *)(in_RDI + 0x60c8) = iVar4;
  local_2c = iVar2;
  if (0x3f < iVar2) {
    local_2c = 0x40;
  }
  iVar4 = tile_log2(1,local_2c);
  *(int *)(in_RDI + 0x60d0) = iVar4;
  local_30 = iVar3;
  if (0x3f < iVar3) {
    local_30 = 0x40;
  }
  iVar4 = tile_log2(1,local_30);
  *(int *)(in_RDI + 0x60d4) = iVar4;
  iVar2 = tile_log2(0x900000 >> (bVar5 * '\x02' & 0x1f),iVar2 * iVar3);
  *(int *)(in_RDI + 0x60d8) = iVar2;
  if (*(int *)(in_RDI + 0x60c8) < *(int *)(in_RDI + 0x60d8)) {
    local_34 = *(undefined4 *)(in_RDI + 0x60d8);
  }
  else {
    local_34 = *(undefined4 *)(in_RDI + 0x60c8);
  }
  *(undefined4 *)(in_RDI + 0x60d8) = local_34;
  return;
}

Assistant:

void av1_get_tile_limits(AV1_COMMON *const cm) {
  const SequenceHeader *const seq_params = cm->seq_params;
  CommonTileParams *const tiles = &cm->tiles;
  const int sb_cols =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_cols, seq_params->mib_size_log2);
  const int sb_rows =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_rows, seq_params->mib_size_log2);

  const int sb_size_log2 = seq_params->mib_size_log2 + MI_SIZE_LOG2;
  tiles->max_width_sb = MAX_TILE_WIDTH >> sb_size_log2;

#if CONFIG_CWG_C013
  bool use_level_7_above = false;
  for (int i = 0; i < seq_params->operating_points_cnt_minus_1 + 1; i++) {
    if (seq_params->seq_level_idx[i] >= SEQ_LEVEL_7_0 &&
        seq_params->seq_level_idx[i] <= SEQ_LEVEL_8_3) {
      // Currently it is assumed that levels 7.x and 8.x are either used for all
      // operating points, or none of them.
      if (i != 0 && !use_level_7_above) {
        aom_internal_error(cm->error, AOM_CODEC_UNSUP_BITSTREAM,
                           "Either all the operating points are levels 7.x or "
                           "8.x, or none of them are.");
      }
      use_level_7_above = true;
    }
  }
  const int max_tile_area_sb =
      (use_level_7_above ? MAX_TILE_AREA_LEVEL_7_AND_ABOVE : MAX_TILE_AREA) >>
      (2 * sb_size_log2);
#else
  const int max_tile_area_sb = MAX_TILE_AREA >> (2 * sb_size_log2);
#endif

  tiles->min_log2_cols = tile_log2(tiles->max_width_sb, sb_cols);
  tiles->max_log2_cols = tile_log2(1, AOMMIN(sb_cols, MAX_TILE_COLS));
  tiles->max_log2_rows = tile_log2(1, AOMMIN(sb_rows, MAX_TILE_ROWS));
  tiles->min_log2 = tile_log2(max_tile_area_sb, sb_cols * sb_rows);
  tiles->min_log2 = AOMMAX(tiles->min_log2, tiles->min_log2_cols);
}